

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *config)

{
  pointer pcVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string prop_filename;
  string filename_config;
  string se;
  string fileName;
  string dest;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  string local_508;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  string local_4c8;
  string local_498;
  string local_478;
  string local_458;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_438;
  long *local_430;
  long local_428;
  long local_420 [2];
  undefined1 local_410 [16];
  size_type local_400;
  pointer local_3f8;
  undefined8 local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e8;
  long local_3e0;
  long *local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  undefined8 local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  long local_278;
  long *local_270;
  undefined8 local_268;
  size_type *local_260;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(&local_430,this);
  if (local_428 == 0) {
    bVar6 = true;
  }
  else {
    local_4e8 = local_4d8;
    pcVar1 = (config->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e8,pcVar1,pcVar1 + config->_M_string_length);
    if (local_4e0 == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_4e8,0,(char *)0x0,0x70fe22);
    }
    local_298._8_8_ = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_298._0_8_ = (this->super_cmExportFileGenerator).FileDir._M_string_length;
    local_4c8._M_string_length = (size_type)&local_4c8.field_2;
    local_4c8._M_dataplus._M_p = &DAT_00000001;
    local_4c8.field_2._M_local_buf[0] = '/';
    local_288 = 1;
    local_278 = local_428;
    local_270 = local_430;
    local_410._8_8_ = &local_400;
    local_410._0_8_ = &DAT_00000001;
    local_400 = CONCAT71(local_400._1_7_,0x2f);
    local_268 = 1;
    views._M_len = 4;
    views._M_array = (iterator)local_298;
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_string_length;
    local_260 = (size_type *)local_410._8_8_;
    cmCatViews_abi_cxx11_(&local_458,views);
    local_298._0_8_ = local_458._M_string_length;
    local_298._8_8_ = local_458._M_dataplus._M_p;
    local_288 = 0xc;
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x71f28a;
    local_278 = local_4e0;
    local_270 = local_4e8;
    local_268 = 6;
    local_260 = (size_type *)0x7028f3;
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_478,views_00);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_478,true,None);
    bVar6 = (*(byte *)((long)&local_278 + (long)*(_func_int **)(local_298._0_8_ + -0x18)) & 5) == 0;
    if (bVar6) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigCxxModuleFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      local_438 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->ConfigCxxModuleTargetFiles,config);
      p_Var4 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var5) {
        do {
          cmGeneratorTarget::GetExportName_abi_cxx11_
                    (&local_498,*(cmGeneratorTarget **)(p_Var4 + 1));
          local_410._0_8_ = (_func_int **)0x7;
          local_410._8_8_ = "target-";
          local_400 = local_498._M_string_length;
          local_3f8 = local_498._M_dataplus._M_p;
          local_4c8._M_dataplus._M_p = &DAT_00000001;
          local_4c8._M_string_length = (size_type)&local_4c8.field_2;
          local_4c8.field_2._M_local_buf[0] = '-';
          local_3f0 = 1;
          local_3e0 = local_4e0;
          local_3d8 = local_4e8;
          local_3d0 = 6;
          local_3c8 = ".cmake";
          views_01._M_len = 5;
          views_01._M_array = (iterator)local_410;
          local_3e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4c8._M_string_length;
          cmCatViews_abi_cxx11_(&local_508,views_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          local_410._0_8_ = local_458._M_string_length;
          local_410._8_8_ = local_458._M_dataplus._M_p;
          local_400 = local_508._M_string_length;
          local_3f8 = local_508._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_410;
          cmCatViews_abi_cxx11_(&local_4c8,views_02);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_438,&local_4c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,
                            CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,
                                     local_4c8.field_2._M_local_buf[0]) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"include(\"${CMAKE_CURRENT_LIST_DIR}/",0x23);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,local_508._M_dataplus._M_p,
                              local_508._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")\n",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var5);
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"cannot write to file \"",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_410,local_478._M_dataplus._M_p,local_478._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_508);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,
                                 local_4c8.field_2._M_local_buf[0]) + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if (local_4e8 != local_4d8) {
      operator_delete(local_4e8,local_4d8[0] + 1);
    }
  }
  if (local_430 != local_420) {
    operator_delete(local_430,local_420[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}